

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::MultAddMT
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  long lVar1;
  long lVar2;
  complex<double> a;
  bool bVar3;
  int64_t iVar4;
  int64_t iVar5;
  complex<double> *pcVar6;
  complex<double> *__src;
  long *plVar7;
  TPZFMatrix<std::complex<double>_> *in_RCX;
  TPZFMatrix<std::complex<double>_> *in_RDX;
  TPZFMatrix<std::complex<double>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  complex<double> aval;
  int64_t icol_1;
  int64_t jc;
  int64_t *JAptr;
  complex<double> *Aptr;
  complex<double> *xptr;
  int64_t icolmax;
  int64_t icolmin;
  complex<double> *zlast_1;
  complex<double> *zp_1;
  complex<double> *zlast;
  complex<double> *yp;
  complex<double> *zp;
  int64_t r;
  complex<double> sum;
  int64_t xcols;
  int64_t icol;
  int64_t ic;
  int64_t ir;
  complex<double> *in_stack_fffffffffffffe28;
  complex<double> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int64_t in_stack_fffffffffffffe40;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe48;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe50;
  long local_188;
  complex<double> *local_130;
  complex<double> *local_b0;
  complex<double> local_78;
  int64_t local_68;
  long local_60;
  long local_58;
  complex<double> *local_50;
  int local_44;
  TPZFMatrix<std::complex<double>_> *local_40;
  TPZFMatrix<std::complex<double>_> *local_38;
  TPZFMatrix<std::complex<double>_> *local_30;
  
  local_44 = in_R8D;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  iVar4 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_38);
  if (iVar4 == iVar5) {
    iVar4 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
    if (iVar4 == iVar5) {
      iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_38);
      iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_40);
      if (iVar4 == iVar5) {
        local_68 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
        std::complex<double>::complex(&local_78,0.0,0.0);
        if (local_44 == 0) {
          local_188 = TPZBaseMatrix::Rows(in_RDI);
        }
        else {
          local_188 = TPZBaseMatrix::Cols(in_RDI);
        }
        for (local_58 = 0; local_58 < local_68; local_58 = local_58 + 1) {
          pcVar6 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40);
          a._M_value._8_8_ = in_stack_fffffffffffffe40;
          a._M_value._0_8_ = in_stack_fffffffffffffe38;
          bVar3 = IsZero(a);
          if (bVar3) {
            local_b0 = TPZFMatrix<std::complex<double>_>::operator()
                                 (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                                  in_stack_fffffffffffffe40);
            pcVar6 = local_b0 + local_188;
            for (; local_b0 != pcVar6; local_b0 = local_b0 + 1) {
              std::complex<double>::operator=(local_b0,0.0);
            }
          }
          else {
            __src = TPZFMatrix<std::complex<double>_>::g(local_38,0,0);
            if (local_40 != local_38) {
              memcpy(pcVar6,__src,local_188 << 4);
            }
          }
        }
        if ((local_68 == 1) && (local_44 == 0)) {
          iVar4 = TPZBaseMatrix::Cols(in_RDI);
          iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
          if (iVar4 == iVar5) {
            iVar4 = TPZBaseMatrix::Rows(in_RDI);
            iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_38);
            if (iVar4 == iVar5) {
              for (local_50 = (complex<double> *)0x0; (long)local_50 < local_188;
                  local_50 = (complex<double> *)((long)local_50 + 1)) {
                plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),(int64_t)local_50);
                lVar1 = *plVar7;
                plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),(long)local_50 + 1);
                lVar2 = *plVar7;
                TPZFMatrix<std::complex<double>_>::g(local_30,0,0);
                TPZVec<std::complex<double>_>::operator[]
                          ((TPZVec<std::complex<double>_> *)(in_RDI + 3),0);
                TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),0);
                std::complex<double>::operator=(&local_78,0.0);
                for (local_60 = lVar1; local_60 < lVar2; local_60 = local_60 + 1) {
                  std::operator*(in_stack_fffffffffffffe28,(complex<double> *)0x148cdb9);
                  std::complex<double>::operator+=
                            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
                }
                std::operator*(in_stack_fffffffffffffe28,(complex<double> *)0x148ce0e);
                TPZFMatrix<std::complex<double>_>::operator()
                          (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40);
                std::complex<double>::operator+=
                          (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              }
              return;
            }
          }
          std::operator<<((ostream *)&std::cout,
                          "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n"
                         );
          return;
        }
        local_58 = 0;
        do {
          if (local_68 <= local_58) {
            return;
          }
          if (local_44 == 0) {
            for (local_50 = (complex<double> *)0x0; pcVar6 = local_50,
                iVar4 = TPZBaseMatrix::Rows(in_RDI), (long)pcVar6 < iVar4;
                local_50 = (complex<double> *)(local_50->_M_value + 1)) {
              std::complex<double>::operator=(&local_78,0.0);
              plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),(int64_t)local_50);
              for (local_60 = *plVar7; lVar1 = local_60,
                  plVar7 = TPZVec<long>::operator[]
                                     ((TPZVec<long> *)(in_RDI + 1),(int64_t)(local_50->_M_value + 1)
                                     ), lVar1 < *plVar7; local_60 = local_60 + 1) {
                in_stack_fffffffffffffe50 =
                     (TPZFMatrix<std::complex<double>_> *)
                     TPZVec<std::complex<double>_>::operator[]
                               ((TPZVec<std::complex<double>_> *)(in_RDI + 3),local_60);
                in_stack_fffffffffffffe48 = local_30;
                plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),local_60);
                TPZFMatrix<std::complex<double>_>::g(in_stack_fffffffffffffe48,*plVar7,local_58);
                std::operator*(in_stack_fffffffffffffe28,(complex<double> *)0x148cf94);
                std::complex<double>::operator+=
                          (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              }
              std::operator*(in_stack_fffffffffffffe28,(complex<double> *)0x148cfe9);
              TPZFMatrix<std::complex<double>_>::operator()
                        (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
              std::complex<double>::operator+=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            }
          }
          else {
            in_stack_fffffffffffffe40 = TPZBaseMatrix::Rows(in_RDI);
            iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30);
            if (in_stack_fffffffffffffe40 != iVar4) {
LAB_0148d098:
              std::operator<<((ostream *)&std::cout,
                              "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n"
                             );
              return;
            }
            iVar4 = TPZBaseMatrix::Cols(in_RDI);
            iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_38);
            if (iVar4 != iVar5) goto LAB_0148d098;
            local_50 = (complex<double> *)0x0;
            while (in_stack_fffffffffffffe30 = local_50, iVar4 = TPZBaseMatrix::Rows(in_RDI),
                  (long)in_stack_fffffffffffffe30 < iVar4) {
              plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),(int64_t)local_50);
              local_130 = (complex<double> *)*plVar7;
              while ((in_stack_fffffffffffffe28 = local_130,
                     plVar7 = TPZVec<long>::operator[]
                                        ((TPZVec<long> *)(in_RDI + 1),
                                         (int64_t)(local_50->_M_value + 1)),
                     (long)in_stack_fffffffffffffe28 < *plVar7 &&
                     (plVar7 = TPZVec<long>::operator[]
                                         ((TPZVec<long> *)(in_RDI + 2),(int64_t)local_130),
                     *plVar7 != -1))) {
                TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),(int64_t)local_130);
                TPZVec<std::complex<double>_>::operator[]
                          ((TPZVec<std::complex<double>_> *)(in_RDI + 3),(int64_t)local_130);
                std::operator*(in_stack_fffffffffffffe28,(complex<double> *)0x148d1bf);
                TPZFMatrix<std::complex<double>_>::g(local_30,(int64_t)local_50,local_58);
                std::operator*(in_stack_fffffffffffffe28,(complex<double> *)0x148d1f8);
                TPZFMatrix<std::complex<double>_>::operator()
                          (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40);
                std::complex<double>::operator+=
                          (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
                local_130 = (complex<double> *)(local_130->_M_value + 1);
              }
              local_50 = (complex<double> *)(local_50->_M_value + 1);
            }
          }
          local_58 = local_58 + 1;
        } while( true );
      }
    }
  }
  std::operator<<((ostream *)&std::cout,
                  "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n"
                 );
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::MultAddMT(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y,
									 TPZFMatrix<TVar> &z,
									 const TVar alpha,const TVar beta,const int opt )  {
	// computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot share storage
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || y.Rows() != z.Rows() )
	{
		cout << "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
		return;
	}
	
	int64_t  ir, ic, icol, xcols;
	xcols = x.Cols();
	TVar sum;
	int64_t  r = (opt) ? this->Cols() : this->Rows();
	
	// Determine how to initialize z
	for(ic=0; ic<xcols; ic++) {
		TVar *zp = &(z(0,ic));
		if(!IsZero(beta)){
			const TVar *yp = &(y.g(0,0));
			TVar *zlast = zp+r;

            if(&z != &y) {
				memcpy(zp,yp,r*sizeof(TVar));
			}
		} else {
			TVar *zp = &(z(0,0)), *zlast = zp+r;
			while(zp != zlast) {
				*zp = 0.;
				zp ++;
			}
		}
	}
	// Compute alpha * A * x
	if(xcols == 1 && opt == 0)
	{
		if(this->Cols() != x.Rows() || this->Rows() != y.Rows())
		{
			cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
			return;
		} 
		for(ir=0; ir<r; ir++) {
			int64_t icolmin = fIA[ir];
			int64_t icolmax = fIA[ir+1];
			const TVar *xptr = &(x.g(0,0));
			TVar *Aptr = &fA[0];
			int64_t *JAptr = &fJA[0];
			for(sum = 0.0, icol=icolmin; icol<icolmax; icol++ ) {
				sum += Aptr[icol] * xptr[JAptr[icol]];
			}
			z(ir,0) += alpha * sum;
		}
	}
	else 
	{
		for(ic=0; ic<xcols; ic++) {
			if(opt == 0) {
				
				for(ir=0; ir<this->Rows(); ir++) {
					for(sum = 0.0, icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						sum += fA[icol] * x.g((fJA[icol]),ic);
					}
					z(ir,ic) += alpha * sum;
				}
			}
			
			// Compute alpha * A^T * x
			else 
			{
				if (this->Rows() != x.Rows() || this->Cols() != y.Rows())
				{
					cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n";
					return; 
				}
				int64_t jc;
				int64_t icol;
				for(ir=0; ir<this->Rows(); ir++) {
					for(icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						if(fJA[icol]==-1) break; //Checa a exist�cia de dado ou n�
						jc = fJA[icol];
						TVar aval = fA[icol];
						//cout << "FA["<<icol<<"] = "<<aval<< " * x["<< ir<<"] ="<< x.Get(ir,ic)<< endl;
						z(jc,ic) += alpha * aval * x.g(ir,ic);
					}
				}
			}
		}
	}
}